

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D5xNvmFlash.cpp
# Opt level: O3

void __thiscall D5xNvmFlash::erase(D5xNvmFlash *this,uint32_t offset,uint32_t size)

{
  uint uVar1;
  undefined8 *puVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar4 = (this->super_Flash)._size * 0x10;
  uVar3 = (ulong)offset / (ulong)uVar4;
  if (offset % uVar4 == 0) {
    uVar1 = (*(this->super_Flash)._vptr_Flash[6])();
    if (size + offset <= uVar1) {
      uVar1 = (uint)uVar3;
      while (uVar1 < ((size + offset + uVar4) - 1) / uVar4) {
        Samba::writeWord((this->super_Flash)._samba,0x41004014,(int)uVar3 * uVar4);
        command(this,'\x01');
        uVar1 = (int)uVar3 + 1;
        uVar3 = (ulong)uVar1;
      }
      return;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_00118778;
  __cxa_throw(puVar2,&FlashEraseError::typeinfo,std::exception::~exception);
}

Assistant:

void
D5xNvmFlash::erase(uint32_t offset, uint32_t size)
{
    uint32_t eraseSize = _size * ERASE_BLOCK_PAGES;

    // Offset must be a multiple of the erase size
    if (offset % eraseSize)
        throw FlashEraseError();

    // Offset and size must be in range
    if (offset + size > totalSize())
        throw FlashEraseError();

    uint32_t eraseEnd = (offset + size + eraseSize - 1) / eraseSize;

    // Erase each erase size set of pages
    for (uint32_t eraseNum = offset / eraseSize; eraseNum < eraseEnd; eraseNum++)
    {
        // Issue erase command
        writeRegU32(NVM_REG_ADDR, eraseNum * eraseSize);
        command(NVM_CMD_EB);
    }
}